

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O2

bool __thiscall VvcUnit::dpb_parameters(VvcUnit *this,int MaxSubLayersMinus1,bool subLayerInfoFlag)

{
  uint uVar1;
  uint uVar2;
  undefined3 in_register_00000011;
  int iVar3;
  
  iVar3 = 0;
  if (CONCAT31(in_register_00000011,subLayerInfoFlag) == 0) {
    iVar3 = MaxSubLayersMinus1;
  }
  iVar3 = iVar3 + -1;
  do {
    iVar3 = iVar3 + 1;
    if (MaxSubLayersMinus1 < iVar3) break;
    uVar1 = extractUEGolombCode(this);
    uVar2 = extractUEGolombCode(this);
    if (uVar1 < uVar2) break;
    uVar1 = extractUEGolombCode(this);
  } while (uVar1 != 0xffffffff);
  return iVar3 <= MaxSubLayersMinus1;
}

Assistant:

bool VvcUnit::dpb_parameters(const int MaxSubLayersMinus1, const bool subLayerInfoFlag)
{
    for (int i = (subLayerInfoFlag ? 0 : MaxSubLayersMinus1); i <= MaxSubLayersMinus1; i++)
    {
        const unsigned dpb_max_dec_pic_buffering_minus1 = extractUEGolombCode();
        const unsigned dpb_max_num_reorder_pics = extractUEGolombCode();
        if (dpb_max_num_reorder_pics > dpb_max_dec_pic_buffering_minus1)
            return true;
        const unsigned dpb_max_latency_increase_plus1 = extractUEGolombCode();
        if (dpb_max_latency_increase_plus1 == UINT_MAX)
            return true;
    }
    return false;
}